

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_grana_2010.h
# Opt level: O2

void __thiscall BBDT<UF>::SecondScan(BBDT<UF> *this)

{
  Mat1b *pMVar1;
  Mat1i *pMVar2;
  uint *puVar3;
  uint *puVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  
  uVar5 = UF::Flatten();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar5;
  puVar3 = UF::P_;
  pMVar1 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  uVar5 = *(uint *)&pMVar2->field_0x8;
  uVar6 = *(uint *)&pMVar2->field_0xc & 0x80000001;
  uVar13 = (long)(int)*(uint *)&pMVar2->field_0xc & 0xfffffffffffffffe;
  lVar11 = 1;
  lVar7 = 0;
  do {
    puVar4 = UF::P_;
    if ((long)((long)(int)uVar5 & 0xfffffffffffffffeU) <= lVar7) {
      if ((uVar5 & 0x80000001) == 1) {
        lVar8 = **(long **)&pMVar1->field_0x48 * lVar7 + *(long *)&pMVar1->field_0x10;
        lVar11 = lVar7 * **(long **)&pMVar2->field_0x48 + *(long *)&pMVar2->field_0x10;
        for (lVar7 = 0; lVar7 < (long)uVar13; lVar7 = lVar7 + 2) {
          lVar12 = (long)*(int *)(lVar11 + lVar7 * 4);
          if (lVar12 < 1) {
            *(undefined8 *)(lVar11 + lVar7 * 4) = 0;
          }
          else {
            uVar5 = puVar4[lVar12];
            uVar9 = uVar5;
            if (*(char *)(lVar8 + lVar7) == '\0') {
              uVar9 = 0;
            }
            *(uint *)(lVar11 + lVar7 * 4) = uVar9;
            if (*(char *)(lVar8 + 1 + lVar7) == '\0') {
              *(undefined4 *)(lVar11 + 4 + lVar7 * 4) = 0;
            }
            else {
              *(uint *)(lVar11 + 4 + lVar7 * 4) = uVar5;
            }
          }
        }
        if (uVar6 == 1) {
          lVar12 = (long)*(int *)(lVar11 + lVar7 * 4);
          uVar5 = 0;
          if ((0 < lVar12) && (uVar5 = 0, *(char *)(lVar7 + lVar8) != '\0')) {
            uVar5 = UF::P_[lVar12];
          }
          *(uint *)(lVar11 + lVar7 * 4) = uVar5;
        }
      }
      return;
    }
    lVar8 = **(long **)&pMVar2->field_0x48;
    lVar17 = lVar8 * lVar7 + *(long *)&pMVar2->field_0x10;
    lVar19 = lVar8 * lVar11 + *(long *)&pMVar2->field_0x10;
    lVar12 = **(long **)&pMVar1->field_0x48 * lVar11 + *(long *)&pMVar1->field_0x10;
    lVar18 = **(long **)&pMVar1->field_0x48 * lVar7 + *(long *)&pMVar1->field_0x10;
    for (uVar14 = 0; (long)uVar14 < (long)uVar13; uVar14 = uVar14 + 2) {
      lVar10 = (long)*(int *)(lVar17 + uVar14 * 4);
      if (lVar10 < 1) {
        *(undefined8 *)(lVar17 + uVar14 * 4) = 0;
        uVar16 = uVar14 | 1;
        *(undefined4 *)(lVar19 + uVar14 * 4) = 0;
        uVar9 = 0;
      }
      else {
        uVar9 = puVar4[lVar10];
        uVar15 = uVar9;
        if (*(char *)(lVar18 + uVar14) == '\0') {
          uVar15 = 0;
        }
        *(uint *)(lVar17 + uVar14 * 4) = uVar15;
        uVar15 = uVar9;
        if (*(char *)(lVar18 + 1 + uVar14) == '\0') {
          uVar15 = 0;
        }
        uVar16 = uVar14 + 1;
        *(uint *)(lVar17 + 4 + uVar14 * 4) = uVar15;
        uVar15 = uVar9;
        if (*(char *)(lVar12 + uVar14) == '\0') {
          uVar15 = 0;
        }
        *(uint *)(lVar19 + uVar14 * 4) = uVar15;
        if (*(char *)(lVar12 + 1 + uVar14) == '\0') {
          uVar9 = 0;
        }
      }
      *(uint *)(lVar17 + lVar8 + uVar16 * 4) = uVar9;
    }
    if (uVar6 == 1) {
      lVar8 = (long)*(int *)(lVar17 + uVar14 * 4);
      if (lVar8 < 1) {
        *(undefined4 *)(lVar17 + uVar14 * 4) = 0;
      }
      else {
        uVar9 = puVar3[lVar8];
        uVar15 = uVar9;
        if (*(char *)(uVar14 + lVar18) == '\0') {
          uVar15 = 0;
        }
        *(uint *)(lVar17 + uVar14 * 4) = uVar15;
        if (*(char *)(uVar14 + lVar12) != '\0') {
          *(uint *)(lVar19 + uVar14 * 4) = uVar9;
          goto LAB_00183168;
        }
      }
      *(undefined4 *)(lVar19 + uVar14 * 4) = 0;
    }
LAB_00183168:
    lVar7 = lVar7 + 2;
    lVar11 = lVar11 + 2;
  } while( true );
}

Assistant:

void SecondScan()
    {   // Second scan
        n_labels_ = LabelsSolver::Flatten();

        int e_rows = img_labels_.rows & 0xfffffffe;
        bool o_rows = img_labels_.rows % 2 == 1;
        int e_cols = img_labels_.cols & 0xfffffffe;
        bool o_cols = img_labels_.cols % 2 == 1;

        int r = 0;
        for (; r < e_rows; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);

            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_fol = (unsigned *)(((char *)img_labels_row) + img_labels_.step.p[0]);
            int c = 0;
            for (; c < e_cols; c += 2) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row[c + 1] > 0)
                        img_labels_row[c + 1] = iLabel;
                    else
                        img_labels_row[c + 1] = 0;
                    if (img_row_fol[c] > 0)
                        img_labels_row_fol[c] = iLabel;
                    else
                        img_labels_row_fol[c] = 0;
                    if (img_row_fol[c + 1] > 0)
                        img_labels_row_fol[c + 1] = iLabel;
                    else
                        img_labels_row_fol[c + 1] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row[c + 1] = 0;
                    img_labels_row_fol[c] = 0;
                    img_labels_row_fol[c + 1] = 0;
                }
            }
            // Last column if the number of columns is odd
            if (o_cols) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row_fol[c] > 0)
                        img_labels_row_fol[c] = iLabel;
                    else
                        img_labels_row_fol[c] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row_fol[c] = 0;
                }
            }
        }
        // Last row if the number of rows is odd
        if (o_rows) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            int c = 0;
            for (; c < e_cols; c += 2) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row[c + 1] > 0)
                        img_labels_row[c + 1] = iLabel;
                    else
                        img_labels_row[c + 1] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row[c + 1] = 0;
                }
            }
            // Last column if the number of columns is odd
            if (o_cols) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                }
            }
        }
    }